

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O1

bool __thiscall
double_conversion::DoubleToStringConverter::ToExponential
          (DoubleToStringConverter *this,double value,int requested_digits,
          StringBuilder *result_builder)

{
  int iVar1;
  bool bVar2;
  long in_FS_OFFSET;
  int decimal_rep_length;
  bool sign;
  int decimal_point;
  char decimal_rep [122];
  int local_c4;
  bool local_bd;
  int local_bc;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  undefined1 *local_98;
  undefined1 *puStack_90;
  undefined1 *local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *puStack_58;
  undefined2 uStack_50;
  undefined6 local_4e;
  undefined2 uStack_48;
  undefined1 *puStack_46;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    if (requested_digits - 0x79U < 0xffffff86) {
      bVar2 = false;
    }
    else {
      local_bc = -0x55555556;
      local_bd = true;
      uStack_48 = 0xaaaa;
      puStack_46 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = 0xaaaa;
      local_4e = 0xaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
      local_98 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
      local_c4 = -0x55555556;
      if (requested_digits == -1) {
        DoubleToAscii(value,SHORTEST,0,(char *)&local_b8,0x7a,&local_bd,&local_c4,&local_bc);
        iVar1 = local_c4;
      }
      else {
        iVar1 = requested_digits + 1;
        DoubleToAscii(value,PRECISION,iVar1,(char *)&local_b8,0x7a,&local_bd,&local_c4,&local_bc);
        if (local_c4 <= requested_digits) {
          memset((void *)((long)&local_b8 + (long)local_c4),0x30,
                 (ulong)(uint)(requested_digits - local_c4) + 1);
        }
      }
      local_c4 = iVar1;
      if ((local_bd == true) && (value != 0.0 || (this->flags_ & 8U) == 0)) {
        iVar1 = *(int *)(result_builder + 0x10);
        *(int *)(result_builder + 0x10) = iVar1 + 1;
        *(undefined1 *)(*(long *)result_builder + (long)iVar1) = 0x2d;
      }
      CreateExponentialRepresentation(this,(char *)&local_b8,local_c4,local_bc + -1,result_builder);
      bVar2 = true;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return bVar2;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    bVar2 = HandleSpecialValues(this,value,result_builder);
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool DoubleToStringConverter::ToExponential(
    double value,
    int requested_digits,
    StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (requested_digits < -1) return false;
  if (requested_digits > kMaxExponentialDigits) return false;

  int decimal_point;
  bool sign;
  // Add space for digit before the decimal point and the '\0' character.
  const int kDecimalRepCapacity = kMaxExponentialDigits + 2;
  DOUBLE_CONVERSION_ASSERT(kDecimalRepCapacity > kBase10MaximalLength);
  char decimal_rep[kDecimalRepCapacity];
#ifndef NDEBUG
  // Problem: there is an assert in StringBuilder::AddSubstring() that
  // will pass this buffer to strlen(), and this buffer is not generally
  // null-terminated.
  memset(decimal_rep, 0, sizeof(decimal_rep));
#endif
  int decimal_rep_length;

  if (requested_digits == -1) {
    DoubleToAscii(value, SHORTEST, 0,
                  decimal_rep, kDecimalRepCapacity,
                  &sign, &decimal_rep_length, &decimal_point);
  } else {
    DoubleToAscii(value, PRECISION, requested_digits + 1,
                  decimal_rep, kDecimalRepCapacity,
                  &sign, &decimal_rep_length, &decimal_point);
    DOUBLE_CONVERSION_ASSERT(decimal_rep_length <= requested_digits + 1);

    for (int i = decimal_rep_length; i < requested_digits + 1; ++i) {
      decimal_rep[i] = '0';
    }
    decimal_rep_length = requested_digits + 1;
  }

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  int exponent = decimal_point - 1;
  CreateExponentialRepresentation(decimal_rep,
                                  decimal_rep_length,
                                  exponent,
                                  result_builder);
  return true;
}